

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O2

void run<boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>,unsigned_int,double>
               (vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                *A,vector<unsigned_int,_std::allocator<unsigned_int>_> *B_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *B_cols,
               vector<double,_std::allocator<double>_> *B_values)

{
  pointer puVar1;
  uint uVar2;
  pointer pfVar3;
  long lVar4;
  stored_size_type sVar5;
  pointer puVar6;
  pointer pfVar7;
  pointer pdVar8;
  long lVar9;
  stored_size_type *psVar10;
  long lVar11;
  uint uVar12;
  uint *puVar13;
  long lVar14;
  size_type __new_size;
  bool bVar15;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_offsets;
  
  pfVar3 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = ((long)(A->
                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar3) / 0x18;
  psVar10 = (stored_size_type *)((long)&(pfVar3->m_flat_tree).m_data.m_seq + 8);
  __new_size = 0;
  while (bVar15 = lVar9 != 0, lVar9 = lVar9 + -1, bVar15) {
    __new_size = __new_size + *psVar10;
    psVar10 = psVar10 + 3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(B_cols,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(B_values,__new_size);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (B_rows,((long)(A->
                           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(A->
                          super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1);
  pfVar3 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = ((long)(A->
                 super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pfVar3) / 0x18;
  for (lVar11 = 0; lVar11 != lVar9; lVar11 = lVar11 + 1) {
    lVar4 = *(long *)&pfVar3[lVar11].m_flat_tree.m_data.m_seq;
    sVar5 = *(stored_size_type *)((long)&pfVar3[lVar11].m_flat_tree.m_data.m_seq + 8);
    puVar6 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar14 = 0; sVar5 << 4 != lVar14; lVar14 = lVar14 + 0x10) {
      puVar1 = puVar6 + *(uint *)(lVar4 + lVar14);
      *puVar1 = *puVar1 + 1;
    }
  }
  puVar6 = (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 1) {
    uVar2 = puVar6[lVar11];
    puVar6[lVar11] = uVar12;
    uVar12 = uVar2 + uVar12;
  }
  (B_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start[lVar9] = uVar12;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&B_offsets,B_rows);
  pfVar3 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pfVar7 = (A->
           super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (lVar9 = 0; lVar9 != ((long)pfVar7 - (long)pfVar3) / 0x18; lVar9 = lVar9 + 1) {
    puVar13 = *(uint **)&pfVar3[lVar9].m_flat_tree.m_data.m_seq;
    puVar6 = (B_cols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (B_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar11 = *(stored_size_type *)((long)&pfVar3[lVar9].m_flat_tree.m_data.m_seq + 8) << 4;
        lVar11 != 0; lVar11 = lVar11 + -0x10) {
      uVar12 = *puVar13;
      uVar2 = B_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      puVar6[uVar2] = (uint)lVar9;
      pdVar8[uVar2] = *(double *)(puVar13 + 2);
      B_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12] =
           B_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar12] + 1;
      puVar13 = puVar13 + 4;
    }
  }
  do_nothing(B_rows,B_cols,B_values);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&B_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void run(std::vector<RowT> const & A,
         std::vector<IndexT> & B_rows,
         std::vector<IndexT> & B_cols,
         std::vector<NumericT> & B_values)
{
  std::size_t B_nnz = 0;

  for (std::size_t i = 0; i < A.size(); ++i)
    B_nnz += A[i].size();

  // initialize datastructures for B:
  B_cols.resize(B_nnz);    // note: initialization with zero not strictly required
  B_values.resize(B_nnz);  // note: initialization with zero not strictly required
  B_rows.resize(A.size() + 1);

  //
  // Stage 1: Compute nonzero pattern for B
  //
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
      B_rows[it->first] += 1;
  }

  // Bring row-start array in place using exclusive-scan:
  IndexT offset = 0;
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    IndexT tmp = B_rows[row];
    B_rows[row] = offset;
    offset += tmp;
  }
  B_rows[A.size()] = offset;


  //
  // Stage 2: Fill with data
  //
  std::vector<IndexT> B_offsets(B_rows); // index of first unwritten element per row

  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
    {
      IndexT col_in_A = it->first;
      IndexT B_nnz_index = B_offsets[col_in_A];
      B_cols[B_nnz_index] = row;
      B_values[B_nnz_index] = it->second;
      B_offsets[col_in_A] += 1;
    }
  }

  do_nothing(B_rows, B_cols, B_values);
}